

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void glfwSwapInterval(int interval)

{
  _GLFWwindow *p_Var1;
  int error;
  
  if (_glfw.initialized == 0) {
    error = 0x10001;
  }
  else {
    p_Var1 = _glfwPlatformGetCurrentContext();
    if (p_Var1 != (_GLFWwindow *)0x0) {
      (*(p_Var1->context).swapInterval)(interval);
      return;
    }
    error = 0x10002;
  }
  _glfwInputError(error,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSwapInterval(int interval)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT();

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return;
    }

    window->context.swapInterval(interval);
}